

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTest.cc
# Opt level: O3

int main(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint32_t uVar4;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  uchar *md;
  string *psVar8;
  string *md_00;
  string *md_01;
  string *md_02;
  string *md_03;
  string *md_04;
  string *md_05;
  string *md_06;
  size_t n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t n_00;
  size_t n_01;
  size_type __dnew;
  SHA256 sha256;
  MD5 md5;
  string hash_with_nonce;
  string result;
  string password_sha256_sha256;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar8 = &local_118;
  md_00 = &local_118;
  md_01 = &local_118;
  md_02 = &local_118;
  md_03 = &local_118;
  md_04 = &local_118;
  md_05 = &local_118;
  md_06 = &local_118;
  puts("-- crc32");
  uVar4 = phosg::crc32((void *)0x0,0,0);
  phosg::expect_generic
            (uVar4 == 0,"0x00000000 != crc32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x18);
  uVar4 = phosg::crc32(anon_var_dwarf_2cf + 0x14,0,0);
  phosg::expect_generic
            (uVar4 == 0,"0x00000000 != crc32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x19);
  uVar4 = phosg::crc32("A",1,0);
  phosg::expect_generic
            (uVar4 == 0xd3d99e8b,"0xD3D99E8B != crc32(\"A\", 1)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1a);
  uVar4 = phosg::crc32("omg",3,0);
  phosg::expect_generic
            (uVar4 == 0xbf4fb41e,"0xBF4FB41E != crc32(\"omg\", 3)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1b);
  uVar4 = phosg::crc32("omg hax",7,0);
  phosg::expect_generic
            (uVar4 == 0xbb24c2e5,"0xBB24C2E5 != crc32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1c);
  uVar4 = phosg::crc32("The quick brown fox jumps over the lazy dog",0x2b,0);
  phosg::expect_generic
            (uVar4 == 0x414fa339,
             "0x414FA339 != crc32(\"The quick brown fox jumps over the lazy dog\", 43)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x1d);
  puts("-- fnv1a32");
  uVar4 = phosg::fnv1a32((void *)0x0,0,0x811c9dc5);
  phosg::expect_generic
            (uVar4 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x22);
  uVar4 = phosg::fnv1a32(anon_var_dwarf_2cf + 0x14,0,0x811c9dc5);
  phosg::expect_generic
            (uVar4 == 0x811c9dc5,"0x811C9DC5 != fnv1a32(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x23);
  uVar4 = phosg::fnv1a32("omg hax",7,0x811c9dc5);
  phosg::expect_generic
            (uVar4 == 0x36e1dfd3,"0x36E1DFD3 != fnv1a32(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x24);
  uVar4 = phosg::fnv1a32("lollercoaster",0xd,0x811c9dc5);
  phosg::expect_generic
            (uVar4 == 0xa73ca50,"0x0A73CA50 != fnv1a32(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x25);
  puts("-- fnv1a64");
  uVar6 = phosg::fnv1a64((void *)0x0,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar6 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(nullptr, 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2a);
  uVar6 = phosg::fnv1a64(anon_var_dwarf_2cf + 0x14,0,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar6 == 0xcbf29ce484222325,"0xCBF29CE484222325 != fnv1a64(\"\", 0)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2b);
  uVar6 = phosg::fnv1a64("omg hax",7,0xcbf29ce484222325);
  phosg::expect_generic
            (uVar6 == 0xe6cac1f92eb65713,"0xE6CAC1F92EB65713 != fnv1a64(\"omg hax\", 7)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2c);
  uVar6 = phosg::fnv1a64("lollercoaster",0xd,0xcbf29ce484222325);
  md = (uchar *)0x2d;
  phosg::expect_generic
            (uVar6 == 0x594b81fb565e8d30,"0x594B81FB565E8D30 != fnv1a64(\"lollercoaster\", 13)",
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x2d);
  puts("-- md5");
  phosg::MD5::MD5((MD5 *)&local_d8,(uchar *)0x0,0,md);
  paVar1 = &local_f8.field_2;
  local_118._M_dataplus._M_p = (pointer)0x10;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -0x2c;
  local_f8._M_dataplus._M_p[1] = '\x1d';
  local_f8._M_dataplus._M_p[2] = -0x74;
  local_f8._M_dataplus._M_p[3] = -0x27;
  local_f8._M_dataplus._M_p[4] = -0x71;
  local_f8._M_dataplus._M_p[5] = '\0';
  local_f8._M_dataplus._M_p[6] = -0x4e;
  local_f8._M_dataplus._M_p[7] = '\x04';
  local_f8._M_dataplus._M_p[8] = -0x17;
  local_f8._M_dataplus._M_p[9] = -0x80;
  local_f8._M_dataplus._M_p[10] = '\t';
  local_f8._M_dataplus._M_p[0xb] = -0x68;
  local_f8._M_dataplus._M_p[0xc] = -0x14;
  local_f8._M_dataplus._M_p[0xd] = -8;
  local_f8._M_dataplus._M_p[0xe] = 'B';
  local_f8._M_dataplus._M_p[0xf] = '~';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::MD5::bin_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x33,&local_f8,&local_118);
  paVar2 = &local_118.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"D41D8CD98F00B204E9800998ECF8427E","");
  phosg::MD5::hex_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x34,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::MD5::MD5((MD5 *)&local_f8,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)psVar8);
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x10;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -0x2c;
  local_f8._M_dataplus._M_p[1] = '\x1d';
  local_f8._M_dataplus._M_p[2] = -0x74;
  local_f8._M_dataplus._M_p[3] = -0x27;
  local_f8._M_dataplus._M_p[4] = -0x71;
  local_f8._M_dataplus._M_p[5] = '\0';
  local_f8._M_dataplus._M_p[6] = -0x4e;
  local_f8._M_dataplus._M_p[7] = '\x04';
  local_f8._M_dataplus._M_p[8] = -0x17;
  local_f8._M_dataplus._M_p[9] = -0x80;
  local_f8._M_dataplus._M_p[10] = '\t';
  local_f8._M_dataplus._M_p[0xb] = -0x68;
  local_f8._M_dataplus._M_p[0xc] = -0x14;
  local_f8._M_dataplus._M_p[0xd] = -8;
  local_f8._M_dataplus._M_p[0xe] = 'B';
  local_f8._M_dataplus._M_p[0xf] = '~';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::MD5::bin_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x36,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"D41D8CD98F00B204E9800998ECF8427E","");
  phosg::MD5::hex_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x37,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::MD5::MD5((MD5 *)&local_f8,(uchar *)"omg hax",7,(uchar *)md_00);
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x10;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -6;
  local_f8._M_dataplus._M_p[1] = -0x39;
  local_f8._M_dataplus._M_p[2] = -0x1f;
  local_f8._M_dataplus._M_p[3] = -0x72;
  local_f8._M_dataplus._M_p[4] = -0x2a;
  local_f8._M_dataplus._M_p[5] = 'Y';
  local_f8._M_dataplus._M_p[6] = -0x65;
  local_f8._M_dataplus._M_p[7] = '7';
  local_f8._M_dataplus._M_p[8] = '|';
  local_f8._M_dataplus._M_p[9] = '`';
  local_f8._M_dataplus._M_p[10] = -0xe;
  local_f8._M_dataplus._M_p[0xb] = -0x36;
  local_f8._M_dataplus._M_p[0xc] = -0x6c;
  local_f8._M_dataplus._M_p[0xd] = -0x34;
  local_f8._M_dataplus._M_p[0xe] = -0x4c;
  local_f8._M_dataplus._M_p[0xf] = '[';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::MD5::bin_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x39,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"FAC7E18ED6599B377C60F2CA94CCB45B","");
  phosg::MD5::hex_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3a,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::MD5::MD5((MD5 *)&local_f8,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                  (uchar *)md_01);
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x10;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -0x62;
  local_f8._M_dataplus._M_p[1] = '\x10';
  local_f8._M_dataplus._M_p[2] = '}';
  local_f8._M_dataplus._M_p[3] = -99;
  local_f8._M_dataplus._M_p[4] = '7';
  local_f8._M_dataplus._M_p[5] = '+';
  local_f8._M_dataplus._M_p[6] = -0x4a;
  local_f8._M_dataplus._M_p[7] = -0x7e;
  local_f8._M_dataplus._M_p[8] = 'k';
  local_f8._M_dataplus._M_p[9] = -0x28;
  local_f8._M_dataplus._M_p[10] = '\x1d';
  local_f8._M_dataplus._M_p[0xb] = '5';
  local_f8._M_dataplus._M_p[0xc] = 'B';
  local_f8._M_dataplus._M_p[0xd] = -0x5c;
  local_f8._M_dataplus._M_p[0xe] = '\x19';
  local_f8._M_dataplus._M_p[0xf] = -0x2a;
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::MD5::bin_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3c,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"9E107D9D372BB6826BD81D3542A419D6","");
  phosg::MD5::hex_abi_cxx11_(&local_118,(MD5 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x3d,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  puts("-- sha1");
  phosg::SHA1::SHA1((SHA1 *)&local_d8,(uchar *)0x0,0,(uchar *)md_02);
  local_118._M_dataplus._M_p = (pointer)0x14;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -0x26;
  local_f8._M_dataplus._M_p[1] = '9';
  local_f8._M_dataplus._M_p[2] = -0x5d;
  local_f8._M_dataplus._M_p[3] = -0x12;
  local_f8._M_dataplus._M_p[4] = '^';
  local_f8._M_dataplus._M_p[5] = 'k';
  local_f8._M_dataplus._M_p[6] = 'K';
  local_f8._M_dataplus._M_p[7] = '\r';
  local_f8._M_dataplus._M_p[8] = '2';
  local_f8._M_dataplus._M_p[9] = 'U';
  local_f8._M_dataplus._M_p[10] = -0x41;
  local_f8._M_dataplus._M_p[0xb] = -0x11;
  local_f8._M_dataplus._M_p[0xc] = -0x6b;
  local_f8._M_dataplus._M_p[0xd] = '`';
  local_f8._M_dataplus._M_p[0xe] = '\x18';
  local_f8._M_dataplus._M_p[0xf] = -0x70;
  local_f8._M_dataplus._M_p[0x10] = -0x51;
  local_f8._M_dataplus._M_p[0x11] = -0x28;
  local_f8._M_dataplus._M_p[0x12] = '\a';
  local_f8._M_dataplus._M_p[0x13] = '\t';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::SHA1::bin_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x43,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709","");
  phosg::SHA1::hex_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x44,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::SHA1::SHA1((SHA1 *)&local_f8,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)md_03);
  local_d8.field_2._M_allocated_capacity._0_4_ = local_f8.field_2._M_allocated_capacity._0_4_;
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x14;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = -0x26;
  local_f8._M_dataplus._M_p[1] = '9';
  local_f8._M_dataplus._M_p[2] = -0x5d;
  local_f8._M_dataplus._M_p[3] = -0x12;
  local_f8._M_dataplus._M_p[4] = '^';
  local_f8._M_dataplus._M_p[5] = 'k';
  local_f8._M_dataplus._M_p[6] = 'K';
  local_f8._M_dataplus._M_p[7] = '\r';
  local_f8._M_dataplus._M_p[8] = '2';
  local_f8._M_dataplus._M_p[9] = 'U';
  local_f8._M_dataplus._M_p[10] = -0x41;
  local_f8._M_dataplus._M_p[0xb] = -0x11;
  local_f8._M_dataplus._M_p[0xc] = -0x6b;
  local_f8._M_dataplus._M_p[0xd] = '`';
  local_f8._M_dataplus._M_p[0xe] = '\x18';
  local_f8._M_dataplus._M_p[0xf] = -0x70;
  local_f8._M_dataplus._M_p[0x10] = -0x51;
  local_f8._M_dataplus._M_p[0x11] = -0x28;
  local_f8._M_dataplus._M_p[0x12] = '\a';
  local_f8._M_dataplus._M_p[0x13] = '\t';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::SHA1::bin_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x46,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"DA39A3EE5E6B4B0D3255BFEF95601890AFD80709","");
  phosg::SHA1::hex_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x47,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::SHA1::SHA1((SHA1 *)&local_f8,(uchar *)"omg hax",7,(uchar *)md_04);
  local_d8.field_2._M_allocated_capacity._0_4_ = local_f8.field_2._M_allocated_capacity._0_4_;
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x14;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = 'j';
  local_f8._M_dataplus._M_p[1] = '0';
  local_f8._M_dataplus._M_p[2] = -0x30;
  local_f8._M_dataplus._M_p[3] = '4';
  local_f8._M_dataplus._M_p[4] = '>';
  local_f8._M_dataplus._M_p[5] = -0x2f;
  local_f8._M_dataplus._M_p[6] = '1';
  local_f8._M_dataplus._M_p[7] = '6';
  local_f8._M_dataplus._M_p[8] = -0x6a;
  local_f8._M_dataplus._M_p[9] = -0x2e;
  local_f8._M_dataplus._M_p[10] = '\v';
  local_f8._M_dataplus._M_p[0xb] = -0x34;
  local_f8._M_dataplus._M_p[0xc] = '%';
  local_f8._M_dataplus._M_p[0xd] = -6;
  local_f8._M_dataplus._M_p[0xe] = '~';
  local_f8._M_dataplus._M_p[0xf] = '*';
  local_f8._M_dataplus._M_p[0x10] = -0x2b;
  local_f8._M_dataplus._M_p[0x11] = -0x57;
  local_f8._M_dataplus._M_p[0x12] = 'w';
  local_f8._M_dataplus._M_p[0x13] = '\x7f';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::SHA1::bin_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x49,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"6A30D0343ED1313696D20BCC25FA7E2AD5A9777F","");
  phosg::SHA1::hex_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4a,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  phosg::SHA1::SHA1((SHA1 *)&local_f8,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
                    (uchar *)md_05);
  local_d8.field_2._M_allocated_capacity._0_4_ = local_f8.field_2._M_allocated_capacity._0_4_;
  local_d8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  local_d8._M_string_length = local_f8._M_string_length;
  local_118._M_dataplus._M_p = (pointer)0x14;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  local_f8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_f8,(size_type *)&local_118,0);
  local_f8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[0] = '/';
  local_f8._M_dataplus._M_p[1] = -0x2c;
  local_f8._M_dataplus._M_p[2] = -0x1f;
  local_f8._M_dataplus._M_p[3] = -0x3a;
  local_f8._M_dataplus._M_p[4] = 'z';
  local_f8._M_dataplus._M_p[5] = '-';
  local_f8._M_dataplus._M_p[6] = '(';
  local_f8._M_dataplus._M_p[7] = -4;
  local_f8._M_dataplus._M_p[8] = -0x13;
  local_f8._M_dataplus._M_p[9] = -0x7c;
  local_f8._M_dataplus._M_p[10] = -0x62;
  local_f8._M_dataplus._M_p[0xb] = -0x1f;
  local_f8._M_dataplus._M_p[0xc] = -0x45;
  local_f8._M_dataplus._M_p[0xd] = 'v';
  local_f8._M_dataplus._M_p[0xe] = -0x19;
  local_f8._M_dataplus._M_p[0xf] = '9';
  local_f8._M_dataplus._M_p[0x10] = '\x1b';
  local_f8._M_dataplus._M_p[0x11] = -0x6d;
  local_f8._M_dataplus._M_p[0x12] = -0x15;
  local_f8._M_dataplus._M_p[0x13] = '\x12';
  local_f8._M_string_length = (size_type)local_118._M_dataplus._M_p;
  local_f8._M_dataplus._M_p[local_118._M_dataplus._M_p] = '\0';
  phosg::SHA1::bin_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4c,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12","");
  phosg::SHA1::hex_abi_cxx11_(&local_118,(SHA1 *)&local_d8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x4d,&local_f8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1));
  }
  puts("-- sha256");
  phosg::SHA256::SHA256((SHA256 *)&local_f8,(uchar *)0x0,0,(uchar *)md_06);
  local_d8._M_dataplus._M_p = &DAT_00000020;
  local_118._M_dataplus._M_p = (pointer)paVar2;
  local_118._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_118,(size_type *)&local_d8,0);
  local_118.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[0x10] = '\'';
  local_118._M_dataplus._M_p[0x11] = -0x52;
  local_118._M_dataplus._M_p[0x12] = 'A';
  local_118._M_dataplus._M_p[0x13] = -0x1c;
  local_118._M_dataplus._M_p[0x14] = 'd';
  local_118._M_dataplus._M_p[0x15] = -0x65;
  local_118._M_dataplus._M_p[0x16] = -0x6d;
  local_118._M_dataplus._M_p[0x17] = 'L';
  local_118._M_dataplus._M_p[0x18] = -0x5c;
  local_118._M_dataplus._M_p[0x19] = -0x6b;
  local_118._M_dataplus._M_p[0x1a] = -0x67;
  local_118._M_dataplus._M_p[0x1b] = '\x1b';
  local_118._M_dataplus._M_p[0x1c] = 'x';
  local_118._M_dataplus._M_p[0x1d] = 'R';
  local_118._M_dataplus._M_p[0x1e] = -0x48;
  local_118._M_dataplus._M_p[0x1f] = 'U';
  local_118._M_dataplus._M_p[0] = -0x1d;
  local_118._M_dataplus._M_p[1] = -0x50;
  local_118._M_dataplus._M_p[2] = -0x3c;
  local_118._M_dataplus._M_p[3] = 'B';
  local_118._M_dataplus._M_p[4] = -0x68;
  local_118._M_dataplus._M_p[5] = -4;
  local_118._M_dataplus._M_p[6] = '\x1c';
  local_118._M_dataplus._M_p[7] = '\x14';
  local_118._M_dataplus._M_p[8] = -0x66;
  local_118._M_dataplus._M_p[9] = -5;
  local_118._M_dataplus._M_p[10] = -0xc;
  local_118._M_dataplus._M_p[0xb] = -0x38;
  local_118._M_dataplus._M_p[0xc] = -0x67;
  local_118._M_dataplus._M_p[0xd] = 'o';
  local_118._M_dataplus._M_p[0xe] = -0x47;
  local_118._M_dataplus._M_p[0xf] = '$';
  local_118._M_string_length = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[local_d8._M_dataplus._M_p] = '\0';
  phosg::SHA256::bin_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x53,&local_118,&local_d8);
  paVar1 = &local_d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855"
             ,"");
  phosg::SHA256::hex_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  psVar8 = &local_d8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x54,&local_118,psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  phosg::SHA256::SHA256((SHA256 *)&local_118,(uchar *)(anon_var_dwarf_2cf + 0x14),0,(uchar *)psVar8)
  ;
  local_f8.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  local_f8.field_2._8_8_ = local_118.field_2._8_8_;
  local_f8._M_dataplus._M_p = local_118._M_dataplus._M_p;
  local_f8._M_string_length = local_118._M_string_length;
  local_d8._M_dataplus._M_p = &DAT_00000020;
  local_118._M_dataplus._M_p = (pointer)paVar2;
  local_118._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_118,(size_type *)&local_d8,0);
  local_118.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[0x10] = '\'';
  local_118._M_dataplus._M_p[0x11] = -0x52;
  local_118._M_dataplus._M_p[0x12] = 'A';
  local_118._M_dataplus._M_p[0x13] = -0x1c;
  local_118._M_dataplus._M_p[0x14] = 'd';
  local_118._M_dataplus._M_p[0x15] = -0x65;
  local_118._M_dataplus._M_p[0x16] = -0x6d;
  local_118._M_dataplus._M_p[0x17] = 'L';
  local_118._M_dataplus._M_p[0x18] = -0x5c;
  local_118._M_dataplus._M_p[0x19] = -0x6b;
  local_118._M_dataplus._M_p[0x1a] = -0x67;
  local_118._M_dataplus._M_p[0x1b] = '\x1b';
  local_118._M_dataplus._M_p[0x1c] = 'x';
  local_118._M_dataplus._M_p[0x1d] = 'R';
  local_118._M_dataplus._M_p[0x1e] = -0x48;
  local_118._M_dataplus._M_p[0x1f] = 'U';
  local_118._M_dataplus._M_p[0] = -0x1d;
  local_118._M_dataplus._M_p[1] = -0x50;
  local_118._M_dataplus._M_p[2] = -0x3c;
  local_118._M_dataplus._M_p[3] = 'B';
  local_118._M_dataplus._M_p[4] = -0x68;
  local_118._M_dataplus._M_p[5] = -4;
  local_118._M_dataplus._M_p[6] = '\x1c';
  local_118._M_dataplus._M_p[7] = '\x14';
  local_118._M_dataplus._M_p[8] = -0x66;
  local_118._M_dataplus._M_p[9] = -5;
  local_118._M_dataplus._M_p[10] = -0xc;
  local_118._M_dataplus._M_p[0xb] = -0x38;
  local_118._M_dataplus._M_p[0xc] = -0x67;
  local_118._M_dataplus._M_p[0xd] = 'o';
  local_118._M_dataplus._M_p[0xe] = -0x47;
  local_118._M_dataplus._M_p[0xf] = '$';
  local_118._M_string_length = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[local_d8._M_dataplus._M_p] = '\0';
  phosg::SHA256::bin_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x56,&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855"
             ,"");
  phosg::SHA256::hex_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  psVar8 = &local_d8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x57,&local_118,psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  phosg::SHA256::SHA256((SHA256 *)&local_118,(uchar *)"omg hax",7,(uchar *)psVar8);
  local_f8.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  local_f8.field_2._8_8_ = local_118.field_2._8_8_;
  local_f8._M_dataplus._M_p = local_118._M_dataplus._M_p;
  local_f8._M_string_length = local_118._M_string_length;
  local_d8._M_dataplus._M_p = &DAT_00000020;
  local_118._M_dataplus._M_p = (pointer)paVar2;
  local_118._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_118,(size_type *)&local_d8,0);
  local_118.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[0x10] = '9';
  local_118._M_dataplus._M_p[0x11] = 'K';
  local_118._M_dataplus._M_p[0x12] = 'G';
  local_118._M_dataplus._M_p[0x13] = 'M';
  local_118._M_dataplus._M_p[0x14] = '8';
  local_118._M_dataplus._M_p[0x15] = -0x71;
  local_118._M_dataplus._M_p[0x16] = '\x10';
  local_118._M_dataplus._M_p[0x17] = -0x2c;
  local_118._M_dataplus._M_p[0x18] = 'z';
  local_118._M_dataplus._M_p[0x19] = '\x0f';
  local_118._M_dataplus._M_p[0x1a] = -0x34;
  local_118._M_dataplus._M_p[0x1b] = '\x02';
  local_118._M_dataplus._M_p[0x1c] = '\x19';
  local_118._M_dataplus._M_p[0x1d] = -0x59;
  local_118._M_dataplus._M_p[0x1e] = 't';
  local_118._M_dataplus._M_p[0x1f] = '0';
  local_118._M_dataplus._M_p[0] = -0x38;
  local_118._M_dataplus._M_p[1] = -2;
  local_118._M_dataplus._M_p[2] = -0x70;
  local_118._M_dataplus._M_p[3] = -0x6b;
  local_118._M_dataplus._M_p[4] = '\x16';
  local_118._M_dataplus._M_p[5] = '8';
  local_118._M_dataplus._M_p[6] = -0x6e;
  local_118._M_dataplus._M_p[7] = '6';
  local_118._M_dataplus._M_p[8] = 'z';
  local_118._M_dataplus._M_p[9] = '1';
  local_118._M_dataplus._M_p[10] = -0x32;
  local_118._M_dataplus._M_p[0xb] = -0x38;
  local_118._M_dataplus._M_p[0xc] = -0x70;
  local_118._M_dataplus._M_p[0xd] = '%';
  local_118._M_dataplus._M_p[0xe] = -0x58;
  local_118._M_dataplus._M_p[0xf] = -0x28;
  local_118._M_string_length = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[local_d8._M_dataplus._M_p] = '\0';
  phosg::SHA256::bin_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x59,&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430"
             ,"");
  phosg::SHA256::hex_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  psVar8 = &local_d8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5a,&local_118,psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  phosg::SHA256::SHA256
            ((SHA256 *)&local_118,(uchar *)"The quick brown fox jumps over the lazy dog",0x2b,
             (uchar *)psVar8);
  local_f8.field_2._M_allocated_capacity = local_118.field_2._M_allocated_capacity;
  local_f8.field_2._8_8_ = local_118.field_2._8_8_;
  local_f8._M_dataplus._M_p = local_118._M_dataplus._M_p;
  local_f8._M_string_length = local_118._M_string_length;
  local_d8._M_dataplus._M_p = &DAT_00000020;
  local_118._M_dataplus._M_p = (pointer)paVar2;
  local_118._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_118,(size_type *)&local_d8,0);
  local_118.field_2._M_allocated_capacity = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[0x10] = -0x73;
  local_118._M_dataplus._M_p[0x11] = 'V';
  local_118._M_dataplus._M_p[0x12] = 'Q';
  local_118._M_dataplus._M_p[0x13] = -0x1c;
  local_118._M_dataplus._M_p[0x14] = 'm';
  local_118._M_dataplus._M_p[0x15] = '<';
  local_118._M_dataplus._M_p[0x16] = -0x25;
  local_118._M_dataplus._M_p[0x17] = 'v';
  local_118._M_dataplus._M_p[0x18] = '-';
  local_118._M_dataplus._M_p[0x19] = '\x02';
  local_118._M_dataplus._M_p[0x1a] = -0x30;
  local_118._M_dataplus._M_p[0x1b] = -0x41;
  local_118._M_dataplus._M_p[0x1c] = '7';
  local_118._M_dataplus._M_p[0x1d] = -0x37;
  local_118._M_dataplus._M_p[0x1e] = -0x1b;
  local_118._M_dataplus._M_p[0x1f] = -0x6e;
  local_118._M_dataplus._M_p[0] = -0x29;
  local_118._M_dataplus._M_p[1] = -0x58;
  local_118._M_dataplus._M_p[2] = -5;
  local_118._M_dataplus._M_p[3] = -0x4d;
  local_118._M_dataplus._M_p[4] = '\a';
  local_118._M_dataplus._M_p[5] = -0x29;
  local_118._M_dataplus._M_p[6] = -0x80;
  local_118._M_dataplus._M_p[7] = -0x6c;
  local_118._M_dataplus._M_p[8] = 'i';
  local_118._M_dataplus._M_p[9] = -0x36;
  local_118._M_dataplus._M_p[10] = -0x66;
  local_118._M_dataplus._M_p[0xb] = -0x44;
  local_118._M_dataplus._M_p[0xc] = -0x50;
  local_118._M_dataplus._M_p[0xd] = '\b';
  local_118._M_dataplus._M_p[0xe] = '.';
  local_118._M_dataplus._M_p[0xf] = 'O';
  local_118._M_string_length = (size_type)local_d8._M_dataplus._M_p;
  local_118._M_dataplus._M_p[local_d8._M_dataplus._M_p] = '\0';
  phosg::SHA256::bin_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5c,&local_118,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592"
             ,"");
  phosg::SHA256::hex_abi_cxx11_(&local_d8,(SHA256 *)&local_f8);
  psVar8 = &local_d8;
  check_string("/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
               ,0x5d,&local_118,psVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"\x15R\x16p\x06u\"\x18wCS\x14q\x01C%S\x1fj\x14","");
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"root","");
  phosg::SHA256::SHA256((SHA256 *)&local_70,(uchar *)&local_b0,n,(uchar *)psVar8);
  phosg::SHA256::bin_abi_cxx11_(&local_d8,(SHA256 *)&local_70);
  n_00 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    n_00 = extraout_RDX_00;
  }
  phosg::SHA256::SHA256((SHA256 *)&local_b0,(uchar *)&local_d8,n_00,(uchar *)psVar8);
  phosg::SHA256::bin_abi_cxx11_(&local_70,(SHA256 *)&local_b0);
  std::operator+(&local_50,&local_70,&local_118);
  phosg::SHA256::SHA256((SHA256 *)&local_90,(uchar *)&local_50,n_01,(uchar *)psVar8);
  phosg::SHA256::bin_abi_cxx11_(&local_b0,(SHA256 *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,0x20,'\0');
  if (local_90._M_string_length != 0) {
    uVar7 = 0;
    do {
      local_90._M_dataplus._M_p[uVar7] =
           local_b0._M_dataplus._M_p[uVar7] ^ local_d8._M_dataplus._M_p[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_90._M_string_length);
  }
  iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_90,anon_var_dwarf_37a);
  phosg::expect_generic
            (iVar5 == 0,
             "result != \"\\x1A\\xE1\\x80\\xD5\\xE5\\xDB\\x7F\\xDF\\x59\\xEA\\x73\\x91\\xB6\\x5E\\x25\\x16\\x73\\xE1\\xB0\\x01\\xC1\\x50\\xAA\\x3A\\x48\\xDC\\x78\\x48\\x8B\\x4B\\x70\\xC4\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/fuzziqersoftware[P]phosg/src/HashTest.cc"
             ,0x68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                             local_d8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  puts("HashTest: all tests passed");
  return 0;
}

Assistant:

int main(int, char**) {
  {
    printf("-- crc32\n");
    expect_eq(0x00000000, crc32(nullptr, 0));
    expect_eq(0x00000000, crc32("", 0));
    expect_eq(0xD3D99E8B, crc32("A", 1));
    expect_eq(0xBF4FB41E, crc32("omg", 3));
    expect_eq(0xBB24C2E5, crc32("omg hax", 7));
    expect_eq(0x414FA339, crc32("The quick brown fox jumps over the lazy dog", 43));
  }

  {
    printf("-- fnv1a32\n");
    expect_eq(0x811C9DC5, fnv1a32(nullptr, 0)); // technically undefined, but should work
    expect_eq(0x811C9DC5, fnv1a32("", 0));
    expect_eq(0x36E1DFD3, fnv1a32("omg hax", 7));
    expect_eq(0x0A73CA50, fnv1a32("lollercoaster", 13));
  }

  {
    printf("-- fnv1a64\n");
    expect_eq(0xCBF29CE484222325, fnv1a64(nullptr, 0)); // technically undefined, but should work
    expect_eq(0xCBF29CE484222325, fnv1a64("", 0));
    expect_eq(0xE6CAC1F92EB65713, fnv1a64("omg hax", 7));
    expect_eq(0x594B81FB565E8D30, fnv1a64("lollercoaster", 13));
  }

  {
    printf("-- md5\n");
    MD5 md5(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("", 0);
    check_string(__FILE__, __LINE__, string("\xD4\x1D\x8C\xD9\x8F\x00\xB2\x04\xE9\x80\x09\x98\xEC\xF8\x42\x7E", 16), md5.bin());
    check_string(__FILE__, __LINE__, "D41D8CD98F00B204E9800998ECF8427E", md5.hex());
    md5 = MD5("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xFA\xC7\xE1\x8E\xD6\x59\x9B\x37\x7C\x60\xF2\xCA\x94\xCC\xB4\x5B", 16), md5.bin());
    check_string(__FILE__, __LINE__, "FAC7E18ED6599B377C60F2CA94CCB45B", md5.hex());
    md5 = MD5("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x9E\x10\x7D\x9D\x37\x2B\xB6\x82\x6B\xD8\x1D\x35\x42\xA4\x19\xD6", 16), md5.bin());
    check_string(__FILE__, __LINE__, "9E107D9D372BB6826BD81D3542A419D6", md5.hex());
  }

  {
    printf("-- sha1\n");
    SHA1 sha1(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("", 0);
    check_string(__FILE__, __LINE__, string("\xDA\x39\xA3\xEE\x5E\x6B\x4B\x0D\x32\x55\xBF\xEF\x95\x60\x18\x90\xAF\xD8\x07\x09", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "DA39A3EE5E6B4B0D3255BFEF95601890AFD80709", sha1.hex());
    sha1 = SHA1("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\x6A\x30\xD0\x34\x3E\xD1\x31\x36\x96\xD2\x0B\xCC\x25\xFA\x7E\x2A\xD5\xA9\x77\x7F", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "6A30D0343ED1313696D20BCC25FA7E2AD5A9777F", sha1.hex());
    sha1 = SHA1("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\x2F\xD4\xE1\xC6\x7A\x2D\x28\xFC\xED\x84\x9E\xE1\xBB\x76\xE7\x39\x1B\x93\xEB\x12", 20), sha1.bin());
    check_string(__FILE__, __LINE__, "2FD4E1C67A2D28FCED849EE1BB76E7391B93EB12", sha1.hex());
  }

  {
    printf("-- sha256\n");
    SHA256 sha256(nullptr, 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("", 0);
    check_string(__FILE__, __LINE__, string("\xE3\xB0\xC4\x42\x98\xFC\x1C\x14\x9A\xFB\xF4\xC8\x99\x6F\xB9\x24\x27\xAE\x41\xE4\x64\x9B\x93\x4C\xA4\x95\x99\x1B\x78\x52\xB8\x55", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "E3B0C44298FC1C149AFBF4C8996FB92427AE41E4649B934CA495991B7852B855", sha256.hex());
    sha256 = SHA256("omg hax", 7);
    check_string(__FILE__, __LINE__, string("\xC8\xFE\x90\x95\x16\x38\x92\x36\x7A\x31\xCE\xC8\x90\x25\xA8\xD8\x39\x4B\x47\x4D\x38\x8F\x10\xD4\x7A\x0F\xCC\x02\x19\xA7\x74\x30", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "C8FE9095163892367A31CEC89025A8D8394B474D388F10D47A0FCC0219A77430", sha256.hex());
    sha256 = SHA256("The quick brown fox jumps over the lazy dog", 43);
    check_string(__FILE__, __LINE__, string("\xD7\xA8\xFB\xB3\x07\xD7\x80\x94\x69\xCA\x9A\xBC\xB0\x08\x2E\x4F\x8D\x56\x51\xE4\x6D\x3C\xDB\x76\x2D\x02\xD0\xBF\x37\xC9\xE5\x92", 32), sha256.bin());
    check_string(__FILE__, __LINE__, "D7A8FBB307D7809469CA9ABCB0082E4F8D5651E46D3CDB762D02D0BF37C9E592", sha256.hex());

    // MySQL caching_sha2_password challenge/response test (password = "root")
    string nonce = "\x15\x52\x16\x70\x06\x75\x22\x18\x77\x43\x53\x14\x71\x01\x43\x25\x53\x1F\x6A\x14";
    string password_sha256 = SHA256("root").bin();
    string password_sha256_sha256 = SHA256(password_sha256).bin();
    string hash_with_nonce = SHA256(password_sha256_sha256 + nonce).bin();
    string result(0x20, '\0');
    for (size_t x = 0; x < result.size(); x++) {
      result[x] = password_sha256[x] ^ hash_with_nonce[x];
    }
    expect_eq(result, "\x1A\xE1\x80\xD5\xE5\xDB\x7F\xDF\x59\xEA\x73\x91\xB6\x5E\x25\x16\x73\xE1\xB0\x01\xC1\x50\xAA\x3A\x48\xDC\x78\x48\x8B\x4B\x70\xC4");
  }

  printf("HashTest: all tests passed\n");
  return 0;
}